

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

Descriptor *
google::protobuf::anon_unknown_19::DefaultFinderFindAnyType
          (Message *message,string *prefix,string *name)

{
  int iVar1;
  undefined4 extraout_var;
  Descriptor *pDVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)prefix);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)prefix);
    if (iVar1 != 0) {
      return (Descriptor *)0x0;
    }
  }
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  pDVar2 = DescriptorPool::FindMessageTypeByName
                     (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) + 0x10),
                      name);
  return pDVar2;
}

Assistant:

const Descriptor* DefaultFinderFindAnyType(const Message& message,
                                           const std::string& prefix,
                                           const std::string& name) {
  if (prefix != internal::kTypeGoogleApisComPrefix &&
      prefix != internal::kTypeGoogleProdComPrefix) {
    return nullptr;
  }
  return message.GetDescriptor()->file()->pool()->FindMessageTypeByName(name);
}